

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall Handler::Migrate(Handler *this)

{
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  bool bVar4;
  LOCATION LVar5;
  ulong uVar6;
  uint uVar7;
  __normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
  __i;
  pointer pPVar8;
  uint32_t *deployedVMIdx;
  pointer deployedVMIdx_00;
  uint uVar9;
  int iVar10;
  uint local_64;
  allocator_type local_5d;
  uint local_5c;
  ulong local_58;
  uint32_t *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  
  uVar7 = this->deployedVMNum * 3;
  local_5c = uVar7 / 100;
  if (99 < uVar7) {
    pPVar1 = (this->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar2 = (this->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar1 != pPVar2) {
      uVar6 = ((long)pPVar2 - (long)pPVar1) / 0x48;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                (pPVar1,pPVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pPVar2 - (long)pPVar1 < 0x481) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                  (pPVar1,pPVar2);
      }
      else {
        pPVar8 = pPVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                  (pPVar1,pPVar8);
        for (; pPVar8 != pPVar2; pPVar8 = pPVar8 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Val_comp_iter<Handler::Migrate()::__0>>
                    (pPVar8);
        }
      }
    }
    ReMapPurchasedServerIdx(this);
    local_58 = ((long)(this->purchasedServers).
                      super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->purchasedServers).
                     super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x48 & 0xffffffff;
    bVar4 = false;
    local_64 = 0;
    while ((0 < (int)local_58 && (!bVar4))) {
      uVar7 = (int)local_58 - 1;
      pPVar1 = (this->purchasedServers).
               super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<std::__detail::_Node_iterator<unsigned_int,true,false>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&tmp,
                 (_Node_iterator<unsigned_int,_true,_false>)
                 pPVar1[uVar7].deployedVM._M_h._M_before_begin._M_nxt,
                 (_Node_iterator<unsigned_int,_true,_false>)0x0,&local_5d);
      SortDeployedVM(this,&tmp);
      local_50 = tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      deployedVMIdx_00 =
           tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      while ((deployedVMIdx_00 != local_50 && (!bVar4))) {
        iVar10 = 0;
        do {
          if ((int)uVar7 <= iVar10) goto LAB_0010cdd2;
          uVar9 = iVar10 + uVar7 >> 1;
          LVar5 = Migrate(this,pPVar1 + uVar7,
                          (this->purchasedServers).
                          super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar9,deployedVMIdx_00);
          iVar10 = uVar9 + 1;
        } while (LVar5 == NONE);
        local_64 = local_64 + 1;
        bVar4 = false;
        if (local_5c <= local_64) {
          bVar4 = true;
        }
LAB_0010cdd2:
        deployedVMIdx_00 = deployedVMIdx_00 + 1;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      local_58 = local_58 - 1;
    }
    this->totalMigrationNum = this->totalMigrationNum + local_64;
  }
  return;
}

Assistant:

void Handler::Migrate() {
    uint32_t threshold = deployedVMNum * 3u / 100u;
    uint32_t migrateNum = 0u;
    bool ended = (migrateNum >= threshold);
    if (ended) return;

    // 将 purchasedServers 按照剩余容量升序排列
    std::sort(purchasedServers.begin(), purchasedServers.end(), [](const PurchasedServer &a, const PurchasedServer &b) {
        return a.vacancyRate != b.vacancyRate ? a.vacancyRate < b.vacancyRate :
               a.remainCpuCoreA + a.remainCpuCoreB + a.remainMemorySizeA + a.remainMemorySizeB <
               b.remainCpuCoreA + b.remainCpuCoreB + b.remainMemorySizeA + b.remainMemorySizeB;;
    });
    // 排序后需要重新映射 purchasedServer id -> purchasedServers index
    ReMapPurchasedServerIdx();

    // originPurchasedServer -> destPurchasedServer
    for (int i = (int) purchasedServers.size() - 1; i >= 0 && !ended; --i) {
        PurchasedServer &originPurchasedServer = purchasedServers[i];
        std::unordered_set<uint32_t> &deployedVM = originPurchasedServer.deployedVM;
        std::vector<uint32_t> tmp(deployedVM.begin(), deployedVM.end());
        SortDeployedVM(tmp);

        for (const uint32_t &deployedVMIdx : tmp) {
            if (ended) break;

            int left = 0, right = i, mid;
            while (left < right) {
                mid = (left + right) / 2;
                PurchasedServer &destPurchasedServer = purchasedServers[mid];
                if (Migrate(originPurchasedServer, destPurchasedServer, deployedVMIdx) != NONE) {
                    if (++migrateNum >= threshold) ended = true;
                    break;
                } else {
                    left = mid + 1;
                }
            }
        }
    }

#ifdef TEST
    totalMigrationNum += migrateNum;
#endif
}